

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

bool __thiscall
ctemplate::SectionTemplateNode::AddTemplateNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template,string *indentation)

{
  size_t *psVar1;
  TemplateTemplateNode *this_00;
  _List_node_base *p_Var2;
  
  if (token != (TemplateToken *)0x0) {
    this_00 = (TemplateTemplateNode *)operator_new(0x80);
    TemplateTemplateNode::TemplateTemplateNode(this_00,token,my_template->strip_,indentation);
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->node_list_).
              super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return true;
  }
  __assert_fail("token",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x68d,
                "bool ctemplate::SectionTemplateNode::AddTemplateNode(TemplateToken *, Template *, const string &)"
               );
}

Assistant:

bool SectionTemplateNode::AddTemplateNode(TemplateToken* token,
                                          Template* my_template,
                                          const string& indentation) {
  assert(token);
  bool success = true;
  node_list_.push_back(
      new TemplateTemplateNode(*token, my_template->strip_, indentation));
  return success;
}